

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.h
# Opt level: O1

Node __thiscall trieste::detail::Make::make_error(Make *this,Location *loc,string *msg)

{
  size_type *psVar1;
  NodeDef *pNVar2;
  string *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Node NVar4;
  Token local_a8;
  undefined1 local_a0 [16];
  undefined1 local_90 [24];
  element_type *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  element_type *peStack_68;
  Location local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  undefined8 local_30;
  undefined8 local_28;
  
  local_a8.def = (TokenDef *)Error;
  local_60.source.super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(msg->_M_dataplus)._M_p;
  local_60.source.super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)msg->_M_string_length;
  if (local_60.source.super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_60.source.super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_60.source.super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_60.source.super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_60.source.super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_60.pos = (msg->field_2)._M_allocated_capacity;
  local_60.len = *(size_t *)((long)&msg->field_2 + 8);
  NodeDef::create((NodeDef *)this,&local_a8,&local_60);
  if (local_60.source.super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.source.super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  pNVar2 = (this->top).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_a8.def = (TokenDef *)ErrorMsg;
  SourceDef::synthetic((SourceDef *)&stack0xffffffffffffffc0,in_RCX);
  local_30 = 0;
  local_28 = in_RCX->_M_string_length;
  NodeDef::create((NodeDef *)local_90,&local_a8,(Location *)&stack0xffffffffffffffc0);
  NodeDef::push_back(pNVar2,(Node *)local_90);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
  }
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  pNVar2 = (this->top).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_a8.def = (TokenDef *)ErrorAst;
  local_90._16_8_ = (msg->_M_dataplus)._M_p;
  local_78 = (element_type *)msg->_M_string_length;
  if (local_78 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      psVar1 = &(local_78->origin_)._M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
      UNLOCK();
    }
    else {
      psVar1 = &(local_78->origin_)._M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
    }
  }
  local_70._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(msg->field_2)._M_allocated_capacity;
  peStack_68 = *(element_type **)((long)&msg->field_2 + 8);
  NodeDef::create((NodeDef *)local_a0,&local_a8,(Location *)(local_90 + 0x10));
  NodeDef::push_back(pNVar2,(Node *)local_a0);
  _Var3._M_pi = extraout_RDX;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
    _Var3._M_pi = extraout_RDX_00;
  }
  if (local_78 != (element_type *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78);
    _Var3._M_pi = extraout_RDX_01;
  }
  NVar4.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  NVar4.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Node)NVar4.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node make_error(Location loc, const std::string& msg)
      {
        auto n = NodeDef::create(Error, loc);
        n->push_back(NodeDef::create(ErrorMsg, msg));
        n->push_back(NodeDef::create(ErrorAst, loc));
        return n;
      }